

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O2

void __thiscall TestClass::ProcessFunc1(TestClass *this,Event1 *ev)

{
  timeval curTime;
  
  TimeUtils::getCurTime(&curTime);
  if (firstFunc1 == '\0') {
    Cancel2(this);
    Func1(this);
    Func2(this,0xf,0x14);
    firstFunc1 = '\x01';
  }
  return;
}

Assistant:

void TestClass::ProcessFunc1( Event1 *ev )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	
	struct timeval curTime;
	TimeUtils::getCurTime( &curTime );
	
	int elapsed = TimeUtils::getDifference( &curTime, &ev->mSent );
	
	LOG("Received Func1 timed event, elapsed time is %d", elapsed);
	// Run once
	if (firstFunc1)
	{
		// Event2 should be coming immediately following this call.  Try to
		// remove it before it arrives
		LOG( "Received Func1 timeout, remove Func2 timed event(s)" );
		Cancel2();
		
		// Now re-send both events
		LOG( "And... do Func1, Func2 again" );
		Func1();
		Func2( 15, 20 );
		
		firstFunc1 = false;
	}
}